

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.h
# Opt level: O0

void __thiscall
FileReaderData::FileReaderData(FileReaderData *this,uint32_t blockSize,uint32_t allocSize)

{
  uint32_t allocSize_local;
  uint32_t blockSize_local;
  FileReaderData *this_local;
  
  ReaderData::ReaderData(&this->super_ReaderData);
  (this->super_ReaderData)._vptr_ReaderData = (_func_int **)&PTR__FileReaderData_004401b8;
  File::File(&this->m_file);
  this->m_fileHeaderSize = 0;
  return;
}

Assistant:

FileReaderData(uint32_t blockSize, uint32_t allocSize) : m_fileHeaderSize(0) {}